

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dg-dump.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  LLVMDependenceGraph *dg;
  bool bVar2;
  uint32_t sl_id;
  pointer pPVar3;
  unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> *puVar4;
  _Base_ptr p_Var5;
  raw_ostream *prVar6;
  LLVMNode *start;
  uint opts;
  int iVar7;
  char *dump_func_only;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  LLVMContext context;
  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> callsites;
  LLVMSlicer slicer;
  char *sc [3];
  string fl;
  raw_os_ostream output;
  SlicerOptions options;
  ofstream ofs;
  LLVMDependenceGraphBuilder builder;
  
  setupStackTraceOnError(argc,argv);
  iVar7 = 1;
  parseSlicerOptions((int)&options,(char **)(ulong)(uint)argc,SUB81(argv,0),false);
  opts = 0x155;
  for (pPVar3 = print_opts.super_list_storage<PrintingOpts,_bool>.Storage.
                super__Vector_base<PrintingOpts,_std::allocator<PrintingOpts>_>._M_impl.
                super__Vector_impl_data._M_start;
      pPVar3 != print_opts.super_list_storage<PrintingOpts,_bool>.Storage.
                super__Vector_base<PrintingOpts,_std::allocator<PrintingOpts>_>._M_impl.
                super__Vector_impl_data._M_finish; pPVar3 = pPVar3 + 1) {
    switch(*pPVar3) {
    case call:
      opts = opts | 0x400;
      break;
    case cfgall:
      opts = opts | 3;
      break;
    case postdom:
      opts = opts | 0x800;
      break;
    case no_cfg:
      opts = opts & 0xfffffffe;
      break;
    case no_control:
      opts = opts & 0xffffffbf;
      break;
    case no_data:
      opts = opts & 0xfffffffb;
      break;
    case no_use:
      opts = opts & 0xffffffef;
    }
  }
  llvm::LLVMContext::LLVMContext(&context);
  parseModule((char *)&M,(LLVMContext *)"llvm-dg-dump",(SlicerOptions *)&context);
  if ((__uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>)
      M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
      super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
      super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>)0x0) goto LAB_0012611d;
  ::dg::llvmdg::LLVMDependenceGraphBuilder::LLVMDependenceGraphBuilder
            (&builder,(Module *)
                      M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                      super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,&options.dgOptions);
  puVar4 = ::dg::llvmdg::LLVMDependenceGraphBuilder::build(&builder);
  dg = (puVar4->_M_t).
       super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
       ._M_t.
       super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>
       .super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl;
  (puVar4->_M_t).
  super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>._M_t
  .super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>.
  super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl = (LLVMDependenceGraph *)0x0;
  p_Var1 = &callsites._M_t._M_impl.super__Rb_tree_header;
  callsites._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  callsites._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  callsites._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  callsites._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  callsites._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (options.slicingCriteria._M_string_length != 0) {
    sc[0] = options.slicingCriteria._M_dataplus._M_p;
    sc[1] = "klee_assume";
    sc[2] = (char *)0x0;
    ::dg::LLVMDependenceGraph::getCallSites(sc,(set *)&callsites);
    ::dg::llvmdg::LLVMSlicer::LLVMSlicer(&slicer);
    bVar2 = std::operator==(&options.slicingCriteria,"ret");
    if (bVar2) {
      start = *(LLVMNode **)(dg + 0x20);
      if (mark_only[0x80] == '\x01') {
        ::dg::Slicer<dg::LLVMNode>::mark(&slicer.super_Slicer<dg::LLVMNode>,start,0,false);
      }
      else {
        sl_id = 0;
LAB_00125f6f:
        ::dg::llvmdg::LLVMSlicer::slice(&slicer,dg,start,sl_id);
      }
    }
    else {
      if (callsites._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        prVar6 = (raw_ostream *)llvm::errs();
        prVar6 = llvm::raw_ostream::operator<<(prVar6,"ERR: slicing criterion not found: ");
        prVar6 = llvm::raw_ostream::operator<<(prVar6,&options.slicingCriteria);
        llvm::raw_ostream::operator<<(prVar6,"\n");
        exit(1);
      }
      sl_id = 0;
      for (p_Var5 = callsites._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != p_Var1; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5))
      {
        sl_id = ::dg::Slicer<dg::LLVMNode>::mark
                          (&slicer.super_Slicer<dg::LLVMNode>,*(LLVMNode **)(p_Var5 + 1),sl_id,false
                          );
      }
      if (mark_only[0x80] == '\0') {
        start = (LLVMNode *)0x0;
        goto LAB_00125f6f;
      }
    }
    if (mark_only[0x80] == '\0') {
      std::__cxx11::string::string((string *)&fl,(string *)&options.inputFile);
      std::__cxx11::string::append((char *)&fl);
      std::ofstream::ofstream(&ofs,(string *)&fl,_S_out);
      _output = std::__throw_length_error;
      prVar6 = (raw_ostream *)llvm::errs();
      prVar6 = llvm::raw_ostream::operator<<(prVar6,"INFO: Sliced away ");
      prVar6 = (raw_ostream *)
               llvm::raw_ostream::operator<<
                         (prVar6,slicer.super_Slicer<dg::LLVMNode>.statistics.nodesRemoved);
      prVar6 = llvm::raw_ostream::operator<<(prVar6," from ");
      prVar6 = (raw_ostream *)
               llvm::raw_ostream::operator<<
                         (prVar6,slicer.super_Slicer<dg::LLVMNode>.statistics.nodesTotal);
      llvm::raw_ostream::operator<<(prVar6," nodes\n");
      llvm::WriteBitcodeToFile
                ((Module *)
                 M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t
                 .super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                 super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,(raw_ostream *)&output,
                 false,(ModuleSummaryIndex *)0x0,false,(array *)0x0);
      llvm::raw_os_ostream::~raw_os_ostream(&output);
      std::ofstream::~ofstream(&ofs);
      std::__cxx11::string::_M_dispose();
    }
    ::dg::llvmdg::LLVMSlicer::~LLVMSlicer(&slicer);
  }
  dump_func_only = (char *)dump_func_only_abi_cxx11_._136_8_;
  if (dump_func_only_abi_cxx11_._136_8_ != 0) {
    dump_func_only = (char *)dump_func_only_abi_cxx11_._128_8_;
  }
  if (bb_only[0x80] == '\x01') {
    ::dg::debug::LLVMDGDumpBlocks::LLVMDGDumpBlocks((LLVMDGDumpBlocks *)&ofs,dg,opts,(char *)0x0);
    ::dg::debug::LLVMDGDumpBlocks::dump((LLVMDGDumpBlocks *)&ofs,(char *)0x0,dump_func_only);
  }
  else {
    ::dg::debug::LLVMDG2Dot::LLVMDG2Dot((LLVMDG2Dot *)&ofs,dg,opts,(char *)0x0);
    ::dg::debug::LLVMDG2Dot::dump((LLVMDG2Dot *)&ofs,(char *)0x0,dump_func_only);
  }
  ::dg::debug::DG2Dot<dg::LLVMNode>::~DG2Dot((DG2Dot<dg::LLVMNode> *)&ofs);
  std::
  _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
  ::~_Rb_tree(&callsites._M_t);
  if (dg != (LLVMDependenceGraph *)0x0) {
    (**(code **)(*(long *)dg + 8))(dg);
  }
  ::dg::llvmdg::LLVMDependenceGraphBuilder::~LLVMDependenceGraphBuilder(&builder);
  iVar7 = 0;
LAB_0012611d:
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr(&M);
  llvm::LLVMContext::~LLVMContext(&context);
  SlicerOptions::~SlicerOptions(&options);
  return iVar7;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    uint32_t opts = PRINT_CFG | PRINT_DD | PRINT_CD | PRINT_USE | PRINT_ID;
    for (auto opt : print_opts) {
        switch (opt) {
        case no_control:
            opts &= ~PRINT_CD;
            break;
        case no_use:
            opts &= ~PRINT_USE;
            break;
        case no_data:
            opts &= ~PRINT_DD;
            break;
        case no_cfg:
            opts &= ~PRINT_CFG;
            break;
        case call:
            opts |= PRINT_CALL;
            break;
        case postdom:
            opts |= PRINT_POSTDOM;
            break;
        case cfgall:
            opts |= PRINT_CFG | PRINT_REV_CFG;
            break;
        }
    }

    if (enable_debug) {
        DBG_ENABLE();
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-dg-dump", context, options);
    if (!M)
        return 1;

    llvmdg::LLVMDependenceGraphBuilder builder(M.get(), options.dgOptions);
    auto dg = builder.build();

    std::set<LLVMNode *> callsites;
    const std::string &slicingCriteria = options.slicingCriteria;
    if (!slicingCriteria.empty()) {
        const char *sc[] = {slicingCriteria.c_str(), "klee_assume", nullptr};

        dg->getCallSites(sc, &callsites);

        llvmdg::LLVMSlicer slicer;

        if (slicingCriteria == "ret") {
            if (mark_only)
                slicer.mark(dg->getExit());
            else
                slicer.slice(dg.get(), dg->getExit());
        } else {
            if (callsites.empty()) {
                errs() << "ERR: slicing criterion not found: "
                       << slicingCriteria << "\n";
                exit(1);
            }

            uint32_t slid = 0;
            for (LLVMNode *start : callsites)
                slid = slicer.mark(start, slid);

            if (!mark_only)
                slicer.slice(dg.get(), nullptr, slid);
        }

        if (!mark_only) {
            std::string fl(options.inputFile);
            fl.append(".sliced");
            std::ofstream ofs(fl);
            llvm::raw_os_ostream output(ofs);

            SlicerStatistics &st = slicer.getStatistics();
            errs() << "INFO: Sliced away " << st.nodesRemoved << " from "
                   << st.nodesTotal << " nodes\n";

#if LLVM_VERSION_MAJOR > 6
            llvm::WriteBitcodeToFile(*M, output);
#else
            llvm::WriteBitcodeToFile(M.get(), output);
#endif
        }
    }
    const char *only_func = nullptr;
    if (!dump_func_only.empty())
        only_func = dump_func_only.c_str();

    if (bb_only) {
        LLVMDGDumpBlocks dumper(dg.get(), opts);
        dumper.dump(nullptr, only_func);
    } else {
        LLVMDG2Dot dumper(dg.get(), opts);
        dumper.dump(nullptr, only_func);
    }

    return 0;
}